

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

bool __thiscall
ON_Hatch::GetTightBoundingBox
          (ON_Hatch *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  ON_Curve *local_50;
  undefined1 local_48 [8];
  ON_CurveArray curves;
  int count;
  int i;
  ON_Xform *xform_local;
  bool bGrowBox_local;
  ON_BoundingBox *tight_bbox_local;
  ON_Hatch *this_local;
  
  curves.super_ON_SimpleArray<ON_Curve_*>.m_count =
       ON_SimpleArray<ON_HatchLoop_*>::Count(&this->m_loops);
  ON_CurveArray::ON_CurveArray
            ((ON_CurveArray *)local_48,curves.super_ON_SimpleArray<ON_Curve_*>.m_count);
  for (curves.super_ON_SimpleArray<ON_Curve_*>.m_capacity = 0;
      curves.super_ON_SimpleArray<ON_Curve_*>.m_capacity <
      curves.super_ON_SimpleArray<ON_Curve_*>.m_count;
      curves.super_ON_SimpleArray<ON_Curve_*>.m_capacity =
           curves.super_ON_SimpleArray<ON_Curve_*>.m_capacity + 1) {
    local_50 = LoopCurve3d(this,curves.super_ON_SimpleArray<ON_Curve_*>.m_capacity);
    ON_SimpleArray<ON_Curve_*>::Append((ON_SimpleArray<ON_Curve_*> *)local_48,&local_50);
  }
  bVar1 = ON_CurveArray::GetTightBoundingBox((ON_CurveArray *)local_48,tight_bbox,bGrowBox,xform);
  ON_CurveArray::~ON_CurveArray((ON_CurveArray *)local_48);
  return bVar1;
}

Assistant:

bool ON_Hatch::GetTightBoundingBox( ON_BoundingBox& tight_bbox, bool bGrowBox, const ON_Xform* xform) const
{
  int i;
  int count = m_loops.Count();
  ON_CurveArray curves(count);
  for( i = 0; i < count; i++)
  {
    curves.Append( LoopCurve3d(i) );
  }
  return curves.GetTightBoundingBox(tight_bbox,bGrowBox,xform);
}